

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void parse_func(LexState *ls,BCLine line)

{
  FuncState *pFVar1;
  GCstr *name;
  bool bVar2;
  uint local_54;
  undefined1 local_50 [4];
  int needself;
  ExpDesc b;
  ExpDesc v;
  FuncState *fs;
  BCLine line_local;
  LexState *ls_local;
  
  lj_lex_next(ls);
  pFVar1 = ls->fs;
  name = lex_str(ls);
  var_lookup_(pFVar1,name,(ExpDesc *)&b.f,1);
  while (ls->tok == 0x2e) {
    expr_field(ls,(ExpDesc *)&b.f);
  }
  bVar2 = ls->tok == 0x3a;
  if (bVar2) {
    expr_field(ls,(ExpDesc *)&b.f);
  }
  local_54 = (uint)bVar2;
  parse_body(ls,(ExpDesc *)local_50,local_54,line);
  pFVar1 = ls->fs;
  bcemit_store(pFVar1,(ExpDesc *)&b.f,(ExpDesc *)local_50);
  pFVar1->bcbase[pFVar1->pc - 1].line = line;
  return;
}

Assistant:

static void parse_func(LexState *ls, BCLine line)
{
  FuncState *fs;
  ExpDesc v, b;
  int needself = 0;
  lj_lex_next(ls);  /* Skip 'function'. */
  /* Parse function name. */
  var_lookup(ls, &v);
  while (ls->tok == '.')  /* Multiple dot-separated fields. */
    expr_field(ls, &v);
  if (ls->tok == ':') {  /* Optional colon to signify method call. */
    needself = 1;
    expr_field(ls, &v);
  }
  parse_body(ls, &b, needself, line);
  fs = ls->fs;
  bcemit_store(fs, &v, &b);
  fs->bcbase[fs->pc - 1].line = line;  /* Set line for the store. */
}